

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O2

void __thiscall Belief::Set(Belief *this,vector<double,_std::allocator<double>_> *belief)

{
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->_m_b).super_SDV,
             (long)(belief->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(belief->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  StateDistributionVector::operator=(&this->_m_b,belief);
  return;
}

Assistant:

void Belief::Set(const vector<double> &belief)
{
    _m_b.resize(belief.size());
    _m_b=belief;
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}